

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVM.pb.cc
# Opt level: O3

LinearKernel * __thiscall CoreML::Specification::LinearKernel::New(LinearKernel *this,Arena *arena)

{
  LinearKernel *this_00;
  
  this_00 = (LinearKernel *)operator_new(0x18);
  LinearKernel(this_00);
  if (arena != (Arena *)0x0) {
    google::protobuf::Arena::Own<CoreML::Specification::LinearKernel>(arena,this_00);
  }
  return this_00;
}

Assistant:

LinearKernel* LinearKernel::New(::google::protobuf::Arena* arena) const {
  LinearKernel* n = new LinearKernel;
  if (arena != NULL) {
    arena->Own(n);
  }
  return n;
}